

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall TPZMatrix<Fad<float>_>::ClassId(TPZMatrix<Fad<float>_> *this)

{
  uint uVar1;
  type tVar2;
  uint uVar3;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TPZMatrix","");
  uVar1 = Hash(&local_40);
  tVar2 = ClassIdOrHash<Fad<float>>();
  uVar3 = TPZBaseMatrix::ClassId(&this->super_TPZBaseMatrix);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return tVar2 * 2 ^ uVar1 ^ uVar3;
}

Assistant:

int TPZMatrix<TVar>::ClassId() const{
    return Hash("TPZMatrix") ^ ClassIdOrHash<TVar>()<<1 ^ TPZBaseMatrix::ClassId();
}